

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::AddUtility(cmTarget *this,string *name,cmMakefile *mf)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  undefined1 local_78 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_40;
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  std::__cxx11::string::string((string *)(local_78 + 0x18),(string *)name);
  if (mf == (cmMakefile *)0x0) {
    local_78._0_8_ = (element_type *)0x0;
    local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    cmMakefile::GetBacktrace((cmMakefile *)local_78);
  }
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )(local_78 + 0x38),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_78 + 0x18),
             (cmListFileBacktrace *)local_78);
  std::
  _Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
  ::_M_insert_unique<BT<std::__cxx11::string>>
            ((_Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
              *)&(_Var1._M_head_impl)->Utilities,
             (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )(local_78 + 0x38));
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )(local_78 + 0x38));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  std::__cxx11::string::~string((string *)(local_78 + 0x18));
  return;
}

Assistant:

void cmTarget::AddUtility(std::string const& name, cmMakefile* mf)
{
  impl->Utilities.insert(
    BT<std::string>(name, mf ? mf->GetBacktrace() : cmListFileBacktrace()));
}